

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

QPoint __thiscall
QMdi::MinOverlapPlacer::place(MinOverlapPlacer *this,QSize *size,QList<QRect> *rects,QRect *domain)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  QRect *pQVar4;
  ulong uVar5;
  QPoint QVar6;
  ulong uVar7;
  QList<QRect> *__range1;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QList<QRect> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  if (0 < (size->wd).m_i) {
    uVar5 = 0;
    if ((size->ht).m_i < 1) goto LAB_00446ea6;
    uVar7 = 0;
    if ((domain->x1).m_i <= (domain->x2).m_i) {
      uVar5 = 0;
      if ((domain->y2).m_i < (domain->y1).m_i) goto LAB_00446ea6;
      lVar3 = (rects->d).size;
      bVar9 = lVar3 == 0;
      if (!bVar9) {
        pQVar4 = (rects->d).ptr;
        if (((pQVar4->x1).m_i <= (pQVar4->x2).m_i) && ((pQVar4->y1).m_i <= (pQVar4->y2).m_i)) {
          lVar8 = 0;
          do {
            bVar9 = lVar3 * 0x10 + -0x10 == lVar8;
            if (bVar9) goto LAB_00446e33;
          } while ((*(int *)((long)&pQVar4[1].x1.m_i + lVar8) <=
                    *(int *)((long)&pQVar4[1].x2.m_i + lVar8)) &&
                  (piVar1 = (int *)((long)&pQVar4[1].y2.m_i + lVar8),
                  piVar2 = (int *)((long)&pQVar4[1].y1.m_i + lVar8), lVar8 = lVar8 + 0x10,
                  *piVar2 <= *piVar1));
        }
        if (!bVar9) goto LAB_00446ea4;
      }
LAB_00446e33:
      local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
      getCandidatePlacements(&local_38,size,rects,domain);
      QVar6 = findBestPlacement(domain,rects,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,0x10,0x10);
        }
      }
      uVar7 = (ulong)QVar6 & 0xffffffff00000000;
      uVar5 = (ulong)QVar6 & 0xffffffff;
      goto LAB_00446ea6;
    }
  }
LAB_00446ea4:
  uVar7 = 0;
  uVar5 = 0;
LAB_00446ea6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (QPoint)(uVar5 | uVar7);
}

Assistant:

QPoint MinOverlapPlacer::place(const QSize &size, const QList<QRect> &rects,
                               const QRect &domain) const
{
    if (size.isEmpty() || !domain.isValid())
        return QPoint();
    for (const QRect &rect : rects) {
        if (!rect.isValid())
            return QPoint();
    }

    QList<QRect> candidates = getCandidatePlacements(size, rects, domain);
    return findBestPlacement(domain, rects, candidates);
}